

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpEndpointName.cpp
# Opt level: O0

void __thiscall IpEndpointName::AddressAndPortAsString(IpEndpointName *this,char *s)

{
  char *s_local;
  IpEndpointName *this_local;
  
  if (this->port == -1) {
    if (this->address == 0xffffffff) {
      sprintf(s,"<any>:<any>");
    }
    else {
      sprintf(s,"%d.%d.%d.%d:<any>",(ulong)((uint)(this->address >> 0x18) & 0xff),
              this->address >> 0x10 & 0xff,(ulong)((uint)(this->address >> 8) & 0xff),
              (ulong)((uint)this->address & 0xff));
    }
  }
  else if (this->address == 0xffffffff) {
    sprintf(s,"<any>:%d",(ulong)(uint)this->port);
  }
  else {
    sprintf(s,"%d.%d.%d.%d:%d",(ulong)((uint)(this->address >> 0x18) & 0xff),
            this->address >> 0x10 & 0xff,(ulong)((uint)(this->address >> 8) & 0xff),
            (ulong)((uint)this->address & 0xff),this->port);
  }
  return;
}

Assistant:

void IpEndpointName::AddressAndPortAsString( char *s ) const
{
	if( port == ANY_PORT ){
		if( address == ANY_ADDRESS ){
			std::sprintf( s, "<any>:<any>" );
		}else{
			std::sprintf( s, "%d.%d.%d.%d:<any>",
				(int)((address >> 24) & 0xFF),
				(int)((address >> 16) & 0xFF),
				(int)((address >> 8) & 0xFF),
				(int)(address & 0xFF) );
		}
	}else{
		if( address == ANY_ADDRESS ){
			std::sprintf( s, "<any>:%d", port );
		}else{
			std::sprintf( s, "%d.%d.%d.%d:%d",
				(int)((address >> 24) & 0xFF),
				(int)((address >> 16) & 0xFF),
				(int)((address >> 8) & 0xFF),
				(int)(address & 0xFF),
				(int)port );
		}
	}	
}